

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int validate_retry_tag(quicly_decoded_packet_t *packet,quicly_cid_t *odcid,
                      ptls_aead_context_t *retry_aead)

{
  size_t __n;
  _func_size_t_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t_uint64_t_void_ptr_size_t *p_Var1;
  long lVar2;
  ulong uVar3;
  size_t sVar4;
  uint8_t *puVar5;
  ulong __n_00;
  size_t asStack_50 [3];
  undefined8 local_38;
  
  __n_00 = (ulong)odcid->len;
  __n = packet->encrypted_off;
  local_38 = __n + __n_00 + 1;
  uVar3 = __n + __n_00 + 0x10 & 0xfffffffffffffff0;
  lVar2 = -uVar3;
  *(uint8_t *)((long)&local_38 - uVar3) = odcid->len;
  *(undefined8 *)((long)asStack_50 + lVar2 + 0x10) = 0x11b400;
  memcpy((void *)((long)&local_38 + lVar2 + 1),odcid,__n_00);
  puVar5 = (packet->octets).base;
  *(undefined8 *)((long)asStack_50 + lVar2 + 0x10) = 0x11b416;
  memcpy((void *)((long)&local_38 + lVar2 + __n_00 + 1),puVar5,__n);
  puVar5 = puVar5 + __n;
  *(undefined8 *)((long)asStack_50 + lVar2 + 8) = 0x10;
  sVar4 = *(size_t *)((long)asStack_50 + lVar2 + 8);
  *(long *)((long)asStack_50 + lVar2 + 8) = local_38;
  p_Var1 = retry_aead->do_decrypt;
  *(undefined8 *)((long)asStack_50 + lVar2) = 0x11b435;
  sVar4 = (*p_Var1)(retry_aead,puVar5,puVar5,sVar4,0,(void *)((long)&local_38 + lVar2),
                    *(size_t *)((long)asStack_50 + lVar2 + 8));
  return (int)(sVar4 == 0);
}

Assistant:

static int validate_retry_tag(quicly_decoded_packet_t *packet, quicly_cid_t *odcid, ptls_aead_context_t *retry_aead)
{
    size_t pseudo_packet_len = 1 + odcid->len + packet->encrypted_off;
    uint8_t pseudo_packet[pseudo_packet_len];
    pseudo_packet[0] = odcid->len;
    memcpy(pseudo_packet + 1, odcid->cid, odcid->len);
    memcpy(pseudo_packet + 1 + odcid->len, packet->octets.base, packet->encrypted_off);
    return ptls_aead_decrypt(retry_aead, packet->octets.base + packet->encrypted_off, packet->octets.base + packet->encrypted_off,
                             PTLS_AESGCM_TAG_SIZE, 0, pseudo_packet, pseudo_packet_len) == 0;
}